

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::LowerBailOnInvalidatedArrayLength(Lowerer *this,Instr *instr,bool isInHelperBlock)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  IRType type;
  undefined4 *puVar3;
  Opnd *pOVar4;
  IndirOpnd *this_00;
  StackSym *pSVar5;
  StackSym *pSVar6;
  Instr *pIVar7;
  LabelInstr *target;
  Instr *this_01;
  ArrayRegOpnd *local_c0;
  undefined1 local_b0 [8];
  AutoReuseOpnd autoReuseInvalidatedLengthOpnd;
  RegOpnd *invalidatedLengthOpnd;
  Instr *callInstr;
  Instr *insertBeforeInstr;
  LabelInstr *skipBailOutLabel;
  Instr *callInstr_1;
  undefined1 local_60 [8];
  AutoReuseOpnd autoReuseLengthBeforeHelperCallOpnd;
  RegOpnd *lengthBeforeHelperCallOpnd;
  ArrayRegOpnd *arrayOpnd;
  RegOpnd *pRStack_30;
  ValueType baseValueType;
  RegOpnd *baseOpnd;
  Func *func;
  bool isInHelperBlock_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3494,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((((instr->m_opcode != StElemI_A) && (instr->m_opcode != StElemI_A_Strict)) &&
      (instr->m_opcode != Memset)) && (instr->m_opcode != Memcopy)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3495,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetDst(instr);
  if (pOVar4 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3496,"(instr->GetDst())","instr->GetDst()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsIndirOpnd(pOVar4);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3497,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  func_00 = instr->m_func;
  pOVar4 = IR::Instr::GetDst(instr);
  this_00 = IR::Opnd::AsIndirOpnd(pOVar4);
  pRStack_30 = IR::IndirOpnd::GetBaseOpnd(this_00);
  arrayOpnd._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&pRStack_30->super_Opnd);
  bVar2 = ValueType::IsNotArray((ValueType *)((long)&arrayOpnd + 6));
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x349d,"(!baseValueType.IsNotArray())","!baseValueType.IsNotArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IR::RegOpnd::IsArrayRegOpnd(pRStack_30);
  if (bVar2) {
    local_c0 = IR::RegOpnd::AsArrayRegOpnd(pRStack_30);
  }
  else {
    local_c0 = (ArrayRegOpnd *)0x0;
  }
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_60);
  if ((local_c0 != (ArrayRegOpnd *)0x0) &&
     (pSVar5 = IR::ArrayRegOpnd::LengthSym(local_c0), pSVar5 != (StackSym *)0x0)) {
    pSVar5 = IR::ArrayRegOpnd::LengthSym(local_c0);
    pSVar6 = IR::ArrayRegOpnd::HeadSegmentLengthSym(local_c0);
    if (pSVar5 != pSVar6) {
      pSVar5 = IR::ArrayRegOpnd::LengthSym(local_c0);
      pSVar6 = IR::ArrayRegOpnd::LengthSym(local_c0);
      type = StackSym::GetType(pSVar6);
      autoReuseLengthBeforeHelperCallOpnd._16_8_ = IR::RegOpnd::New(pSVar5,type,func_00);
      IR::AutoReuseOpnd::Initialize
                ((AutoReuseOpnd *)local_60,(Opnd *)autoReuseLengthBeforeHelperCallOpnd._16_8_,
                 func_00,true);
      goto LAB_007c9985;
    }
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pRStack_30->super_Opnd);
  pIVar7 = IR::Instr::New(Call,func_00);
  autoReuseLengthBeforeHelperCallOpnd._16_8_ = IR::RegOpnd::New(TyUint32,func_00);
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)local_60,(Opnd *)autoReuseLengthBeforeHelperCallOpnd._16_8_,func_00,
             true);
  IR::Instr::SetDst(pIVar7,(Opnd *)autoReuseLengthBeforeHelperCallOpnd._16_8_);
  IR::Instr::InsertBefore(instr,pIVar7);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,pIVar7,HelperArray_Jit_GetArrayLength,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
LAB_007c9985:
  target = IR::Instr::GetOrCreateContinueLabel(instr,isInHelperBlock);
  LowerOneBailOutKind(this,instr,BailOutOnInvalidatedArrayLength,isInHelperBlock,false);
  pIVar7 = instr->m_next;
  LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar7,&pRStack_30->super_Opnd);
  LowererMD::LoadHelperArgument
            (&this->m_lowererMD,pIVar7,(Opnd *)autoReuseLengthBeforeHelperCallOpnd._16_8_);
  this_01 = IR::Instr::New(Call,func_00);
  autoReuseInvalidatedLengthOpnd._16_8_ = IR::RegOpnd::New(TyUint8,func_00);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_b0,(Opnd *)autoReuseInvalidatedLengthOpnd._16_8_,func_00,true);
  IR::Instr::SetDst(this_01,(Opnd *)autoReuseInvalidatedLengthOpnd._16_8_);
  IR::Instr::InsertBefore(pIVar7,this_01);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,this_01,HelperArray_Jit_OperationInvalidatedArrayLength,
             (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  InsertTestBranch((Opnd *)autoReuseInvalidatedLengthOpnd._16_8_,
                   (Opnd *)autoReuseInvalidatedLengthOpnd._16_8_,BrEq_A,target,pIVar7);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_b0);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_60);
  return;
}

Assistant:

void Lowerer::LowerBailOnInvalidatedArrayLength(IR::Instr *const instr, const bool isInHelperBlock)
{
    /*
        // Generate checks for whether the length changed during the helper call

        if(!(arrayOpnd && arrayOpnd.LengthSym() && arrayOpnd.LengthSym() != arrayOpnd.HeadSegmentLengthSym()))
        {
            // Record the array length before the helper call
            lengthBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayLength(base)
        }

        helperCall:
            (Helper call and other bailout checks)

        // If the array has a different length after the helper call, then this store needs to bail out
        invalidatedLength = JavascriptArray::Jit_OperationInvalidatedArrayLength(lengthBeforeHelperCall, base)
        test invalidatedLength, invalidatedLength
        jz $skipBailOut

        (Bail out with IR::BailOutOnInvalidatedArrayLength)

        $skipBailOut:
    */

    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    Assert(instr->GetDst());
    Assert(instr->GetDst()->IsIndirOpnd());

    Func *const func = instr->m_func;

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    Assert(!baseValueType.IsNotArray());
    IR::ArrayRegOpnd *const arrayOpnd = baseOpnd->IsArrayRegOpnd() ? baseOpnd->AsArrayRegOpnd() : nullptr;

    IR::RegOpnd *lengthBeforeHelperCallOpnd;
    IR::AutoReuseOpnd autoReuseLengthBeforeHelperCallOpnd;
    if(arrayOpnd && arrayOpnd->LengthSym() && arrayOpnd->LengthSym() != arrayOpnd->HeadSegmentLengthSym())
    {
        lengthBeforeHelperCallOpnd = IR::RegOpnd::New(arrayOpnd->LengthSym(), arrayOpnd->LengthSym()->GetType(), func);
        autoReuseLengthBeforeHelperCallOpnd.Initialize(lengthBeforeHelperCallOpnd, func);
    }
    else
    {
        // Record the array length before the helper call
        //     lengthBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayLength(base)
        m_lowererMD.LoadHelperArgument(instr, baseOpnd);
        IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
        lengthBeforeHelperCallOpnd = IR::RegOpnd::New(TyUint32, func);
        autoReuseLengthBeforeHelperCallOpnd.Initialize(lengthBeforeHelperCallOpnd, func);
        callInstr->SetDst(lengthBeforeHelperCallOpnd);
        instr->InsertBefore(callInstr);
        m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayLength);
    }

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isInHelperBlock);
    LowerOneBailOutKind(instr, IR::BailOutOnInvalidatedArrayLength, isInHelperBlock);
    IR::Instr *const insertBeforeInstr = instr->m_next;

    // If the array has a different length after the helper call, then this store needs to bail out
    //     invalidatedLength = JavascriptArray::Jit_OperationInvalidatedArrayLength(lengthBeforeHelperCall, base)
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, baseOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, lengthBeforeHelperCallOpnd);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    IR::RegOpnd *const invalidatedLengthOpnd = IR::RegOpnd::New(TyUint8, func);
    const IR::AutoReuseOpnd autoReuseInvalidatedLengthOpnd(invalidatedLengthOpnd, func);
    callInstr->SetDst(invalidatedLengthOpnd);
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_OperationInvalidatedArrayLength);

    //     test invalidatedLength, invalidatedLength
    //     jz $skipBailOut
    InsertTestBranch(
        invalidatedLengthOpnd,
        invalidatedLengthOpnd,
        Js::OpCode::BrEq_A,
        skipBailOutLabel,
        insertBeforeInstr);

    //     (Bail out with IR::BailOutOnInvalidatedArrayLength)
    //     $skipBailOut:
}